

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

void __thiscall
Typelib::Importer::load(Importer *this,string *path,config_set *config,Registry *registry)

{
  ImportError *this_00;
  allocator local_259;
  string local_258;
  ifstream s;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&s,(path->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_s + -0x18)] & 5) == 0) {
    (*this->_vptr_Importer[2])(this,&s,config,registry);
    std::ifstream::~ifstream(&s);
    return;
  }
  this_00 = (ImportError *)__cxa_allocate_exception(0x60);
  std::__cxx11::string::string((string *)&local_258,"cannot open for reading",&local_259);
  ImportError::ImportError(this_00,path,&local_258,0,0);
  __cxa_throw(this_00,&ImportError::typeinfo,ImportError::~ImportError);
}

Assistant:

void Importer::load
    ( std::string const& path
    , utilmm::config_set const& config
    , Registry& registry)
{
    // Check that the input file can be opened
    ifstream s(path.c_str());
    if (!s)
        throw ImportError(path, "cannot open for reading");
    load(s, config, registry);
}